

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-offline-flexibility-estimator.cpp
# Opt level: O0

int testDerivator(void)

{
  uint uVar1;
  uint uVar2;
  Scalar *pSVar3;
  Matrix *pMVar4;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  ostream *this_00;
  void *this_01;
  double dVar5;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_a80;
  uint local_a64;
  ostream local_a60 [4];
  uint i_2;
  ofstream f;
  kine local_860 [8];
  IndexedMatrixArray state;
  Matrix local_808;
  Type local_7f0;
  Matrix<double,__1,_1,_0,__1,_1> local_7b8;
  Type local_7a8;
  Type local_770;
  Matrix<double,__1,_1,_0,__1,_1> local_738;
  Type local_728;
  ConstantReturnType local_6f0;
  undefined1 local_6d8 [8];
  Vector xi;
  IndexedMatrixArray local_6c0 [4];
  uint i_1;
  IndexedMatrixArray dta;
  IndexedMatrixArray local_668 [88];
  IndexedMatrixArray local_610 [88];
  Matrix local_5b8;
  int local_59c;
  undefined1 local_598 [4];
  int j;
  undefined1 local_580 [8];
  Vector uk;
  undefined1 local_568 [4];
  uint i;
  undefined1 local_550 [8];
  Vector x0;
  DynamicalSystemSimulator sim;
  non_const_type local_450;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_448;
  GaussianWhiteNoise local_438 [8];
  GaussianWhiteNoise MeasurementNoise;
  double local_400;
  IdentityReturnType local_3f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_3e0;
  undefined1 local_3a0 [8];
  Matrix r1;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_380;
  GaussianWhiteNoise local_370 [8];
  GaussianWhiteNoise processNoise;
  double local_338;
  IdentityReturnType local_330;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_318;
  undefined1 local_2d8 [8];
  Matrix q1;
  IMUDynamicalSystem imu;
  undefined1 local_168 [8];
  Matrix r;
  Matrix q;
  IndexedMatrixArray u;
  IndexedMatrixArray local_d0 [8];
  IndexedMatrixArray y;
  IndexedMatrixArray local_78 [8];
  IndexedMatrixArray x;
  uint measurementSize;
  uint stateSize;
  double dt;
  uint kmax;
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_78);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_d0);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray
            ((IndexedMatrixArray *)
             &q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_168);
  stateObservation::IMUDynamicalSystem::IMUDynamicalSystem
            ((IMUDynamicalSystem *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_330,0x12,0x12);
  local_338 = 0.0;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator*(&local_318,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
               *)&local_330,&local_338);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_2d8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_318);
  uVar1 = stateObservation::IMUDynamicalSystem::getStateSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise(local_370,uVar1);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)local_370);
  stateObservation::IMUDynamicalSystem::setProcessNoise
            ((NoiseBase *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2d8);
  local_380 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_2d8,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *
                         )&r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)
             &r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_380);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_3f8,6,6);
  local_400 = 0.0;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator*(&local_3e0,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
               *)&local_3f8,&local_400);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_3a0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_3e0);
  uVar1 = stateObservation::IMUDynamicalSystem::getMeasurementSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise(local_438,uVar1);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)local_438);
  stateObservation::IMUDynamicalSystem::setMeasurementNoise
            ((NoiseBase *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  local_450 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3a0);
  local_448 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3a0,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *
                         )&local_450);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_168,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_448);
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor
            ((DynamicalSystemFunctorBase *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)local_568,0x12,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_550,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_568);
  stateObservation::DynamicalSystemSimulator::setState
            ((Matrix *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (uint)local_550);
  for (uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0;
      uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ < 300
      ; uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
             _4_4_ + 1) {
    uVar1 = stateObservation::IMUDynamicalSystem::getInputSize();
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((ConstantReturnType *)local_598,(ulong)uVar1,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_580,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_598);
    dVar5 = sin((double)uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows._4_4_ * 0.3141592653589793);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,0);
    *pSVar3 = dVar5 * 0.4;
    dVar5 = sin((double)uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows._4_4_ * 0.2617993877991494);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,1);
    *pSVar3 = dVar5 * 0.6;
    dVar5 = sin((double)uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows._4_4_ * 0.6283185307179586);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,2);
    *pSVar3 = dVar5 * 0.2;
    dVar5 = sin((double)uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows._4_4_ * 0.2617993877991494);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,3);
    *pSVar3 = dVar5 * 10.0;
    dVar5 = sin((double)uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows._4_4_ * 0.20943951023931953);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,4);
    *pSVar3 = dVar5 * 0.07;
    dVar5 = sin((double)uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows._4_4_ * 0.6283185307179586);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,5);
    *pSVar3 = dVar5 * 0.05;
    for (local_59c = 0; local_59c < 10; local_59c = local_59c + 1) {
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_5b8,
                 (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_580);
      stateObservation::IndexedMatrixArray::setValue
                ((IndexedMatrixArray *)
                 &q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,&local_5b8,
                 local_59c +
                 uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                 _4_4_ * 10);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_5b8);
    }
    stateObservation::DynamicalSystemSimulator::setInput
              ((Matrix *)
               &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (uint)local_580);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_580);
  }
  stateObservation::IMUDynamicalSystem::setSamplingPeriod(0.001);
  stateObservation::DynamicalSystemSimulator::simulateDynamicsTo((int)&x0 + 8);
  stateObservation::DynamicalSystemSimulator::getMeasurementArray((uint)local_610,(int)&x0 + 8);
  stateObservation::IndexedMatrixArray::operator=(local_d0,local_610);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_610);
  stateObservation::DynamicalSystemSimulator::getStateArray((uint)local_668,(int)&x0 + 8);
  stateObservation::IndexedMatrixArray::operator=(local_78,local_668);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_668);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_550);
  stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  stateObservation::GaussianWhiteNoise::~GaussianWhiteNoise(local_438);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_3a0);
  stateObservation::GaussianWhiteNoise::~GaussianWhiteNoise(local_370);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_2d8);
  stateObservation::IMUDynamicalSystem::~IMUDynamicalSystem
            ((IMUDynamicalSystem *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_6c0);
  xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       stateObservation::IndexedMatrixArray::getFirstIndex(local_78);
  while( true ) {
    uVar1 = xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
    ;
    uVar2 = stateObservation::IndexedMatrixArray::getLastIndex(local_78);
    if (uVar2 < uVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_6f0,6,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_6d8,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_6f0);
    pMVar4 = stateObservation::IndexedMatrixArray::operator[]
                       (local_78,xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows._4_4_);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_738,pMVar4);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_728,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_738,0,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<int>
              (&local_770,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_6d8,3);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::operator=(&local_770,&local_728)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_738);
    pMVar4 = stateObservation::IndexedMatrixArray::operator[]
                       (local_78,xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows._4_4_);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_7b8,pMVar4);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_7a8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_7b8,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
              (&local_7f0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_6d8,3);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::operator=(&local_7f0,&local_7a8)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_7b8);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_808,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_6d8);
    stateObservation::IndexedMatrixArray::setValue
              (local_6c0,&local_808,
               xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
               _4_4_);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_808);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_6d8);
    xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ +
         1;
  }
  stateObservation::kine::reconstructStateTrajectory(local_860,local_6c0,0.001);
  std::ofstream::ofstream(local_a60);
  std::ofstream::open(local_a60,"trajectory.dat",0x10);
  local_a64 = stateObservation::IndexedMatrixArray::getFirstIndex(local_78);
  while( true ) {
    uVar1 = local_a64;
    uVar2 = stateObservation::IndexedMatrixArray::getLastIndex(local_78);
    if (uVar2 < uVar1) break;
    this = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
           stateObservation::IndexedMatrixArray::operator[](local_78,local_a64);
    other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            stateObservation::IndexedMatrixArray::operator[]
                      ((IndexedMatrixArray *)local_860,local_a64);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-(&local_a80,this,other);
    this_00 = Eigen::operator<<(local_a60,
                                (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                 *)&local_a80);
    this_01 = (void *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    local_a64 = local_a64 + 1;
  }
  std::ofstream::~ofstream(local_a60);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray((IndexedMatrixArray *)local_860);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_6c0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_168);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray
            ((IndexedMatrixArray *)
             &q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_d0);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_78);
  return 0;
}

Assistant:

int testDerivator()
{
    /// The number of samples
    const unsigned kmax=3000;

    ///sampling period
    const double dt=1e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    //const unsigned inputSize=6;

    ///The array containing all the states, the measurements and the inputs
    IndexedMatrixArray x;
    IndexedMatrixArray y;
    IndexedMatrixArray u;

    ///The covariance matrix of the process noise and the measurement noise
    Matrix q;
    Matrix r;

    {
        ///simulation of the signal
        /// the IMU dynamical system functor
        IMUDynamicalSystem imu;

        ///The process noise initialization
        Matrix q1=Matrix::Identity(stateSize,stateSize)*0.00;
        GaussianWhiteNoise processNoise(imu.getStateSize());
        processNoise.setStandardDeviation(q1);
        imu.setProcessNoise( & processNoise );
        q=q1*q1.transpose();

        ///The measurement noise initialization
        Matrix r1=Matrix::Identity(measurementSize,measurementSize)*0.0;
        GaussianWhiteNoise MeasurementNoise(imu.getMeasurementSize());
        MeasurementNoise.setStandardDeviation(r1);
        imu.setMeasurementNoise( & MeasurementNoise );
        r=r1*r1.transpose();

        ///the simulator initalization
        DynamicalSystemSimulator sim;
        sim.setDynamicsFunctor(&imu);

        ///initialization of the state vector
        Vector x0=Vector::Zero(stateSize,1);
        sim.setState(x0,0);

        ///construction of the input
        /// the input is constant over 10 time samples
        for (unsigned i=0;i<kmax/10;++i)
        {
            Vector uk=Vector::Zero(imu.getInputSize(),1);

            uk[0]=0.4 * sin(M_PI/10*i);
            uk[1]=0.6 * sin(M_PI/12*i);
            uk[2]=0.2 * sin(M_PI/5*i);

            uk[3]=10  * sin(M_PI/12*i);
            uk[4]=0.07  * sin(M_PI/15*i);
            uk[5]=0.05 * sin(M_PI/5*i);

            ///filling the 10 time samples of the constant input
            for (int j=0;j<10;++j)
            {
                u.setValue(uk,i*10+j);
            }

            ///give the input to the simulator
            ///we only need to give one value and the
            ///simulator takes automatically the appropriate value
            sim.setInput(uk,10*i);

        }

        ///set the sampling perdiod to the functor
        imu.setSamplingPeriod(dt);

        ///launched the simulation to the time kmax+1
        sim.simulateDynamicsTo(kmax+1);

        ///extract the array of measurements and states
        y = sim.getMeasurementArray(1,kmax);
        x = sim.getStateArray(1,kmax);
    }

    IndexedMatrixArray dta;

    for (unsigned i=x.getFirstIndex() ; i<=x.getLastIndex() ; ++i)
    {
        Vector xi = Vector::Zero(6,1);

        xi.head(3) = Vector(x[i]).segment(kine::pos,3);
        xi.tail(3) = Vector(x[i]).segment(kine::ori,3);

        dta.setValue(xi,i);
    }

    IndexedMatrixArray state = kine::reconstructStateTrajectory(dta,dt);

    ///file of output
    std::ofstream f;
    f.open("trajectory.dat");

    for (unsigned i=x.getFirstIndex() ; i<=x.getLastIndex() ; ++i)
    {
        //f<<dta[i].transpose()<<"\t#####\t\t"<<Vector(Vector(x[i]).segment(9,3)).transpose()<<"\t#####\t\t"<<(x[i]-state[i]).transpose()<<std::endl;
        f<<(x[i]-state[i])<<std::endl<<std::endl;
    }

    return 0;


}